

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::calendar_impl::calendar_impl(calendar_impl *this,calendar_impl *other)

{
  Calendar *pCVar1;
  Calendar *pCVar2;
  
  (this->super_abstract_calendar)._vptr_abstract_calendar = (_func_int **)&PTR_clone_001daec8;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->encoding_)._M_dataplus._M_p = (pointer)&(this->encoding_).field_2;
  (this->encoding_)._M_string_length = 0;
  (this->encoding_).field_2._M_local_buf[0] = '\0';
  (this->calendar_).ptr_ = (Calendar *)0x0;
  pCVar2 = (Calendar *)(**(code **)(*(long *)(other->calendar_).ptr_ + 0x18))();
  pCVar1 = (this->calendar_).ptr_;
  if (pCVar1 != (Calendar *)0x0) {
    (**(code **)(*(long *)pCVar1 + 8))();
  }
  (this->calendar_).ptr_ = pCVar2;
  std::__cxx11::string::_M_assign((string *)&this->encoding_);
  return;
}

Assistant:

calendar_impl(calendar_impl const &other)
        {
            calendar_.reset(other.calendar_->clone());
            encoding_ = other.encoding_;
        }